

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatMem.c
# Opt level: O1

char * Msat_MmStepEntryFetch(Msat_MmStep_t *p,int nBytes)

{
  char *pcVar1;
  
  if (nBytes == 0) {
    return (char *)0x0;
  }
  if (p->nMapSize < nBytes) {
    pcVar1 = (char *)malloc((long)nBytes);
    return pcVar1;
  }
  pcVar1 = Msat_MmFixedEntryFetch(p->pMap[nBytes]);
  return pcVar1;
}

Assistant:

char * Msat_MmStepEntryFetch( Msat_MmStep_t * p, int nBytes )
{
    if ( nBytes == 0 )
        return NULL;
    if ( nBytes > p->nMapSize )
    {
//        printf( "Allocating %d bytes.\n", nBytes );
        return ABC_ALLOC( char, nBytes );
    }
    return Msat_MmFixedEntryFetch( p->pMap[nBytes] );
}